

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O3

int Gia_ManQuantExist(Gia_Man_t *p0,int iLit,_func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  int iVar1;
  Vec_Int_t *vQuantCis;
  int *piVar2;
  Vec_Int_t *vQuantSide;
  Vec_Int_t *vQuantAnds;
  
  vQuantCis = (Vec_Int_t *)malloc(0x10);
  vQuantCis->nCap = 100;
  vQuantCis->nSize = 0;
  piVar2 = (int *)malloc(400);
  vQuantCis->pArray = piVar2;
  vQuantSide = (Vec_Int_t *)malloc(0x10);
  vQuantSide->nCap = 100;
  vQuantSide->nSize = 0;
  piVar2 = (int *)malloc(400);
  vQuantSide->pArray = piVar2;
  vQuantAnds = (Vec_Int_t *)malloc(0x10);
  vQuantAnds->nCap = 100;
  vQuantAnds->nSize = 0;
  piVar2 = (int *)malloc(400);
  vQuantAnds->pArray = piVar2;
  if (-1 < iLit) {
    Gia_ManQuantMarkUsedCis(p0,pFuncCiToKeep,pData);
    Gia_ManIncrementTravId(p0);
    Gia_ManQuantCollect_rec(p0,(uint)iLit >> 1,vQuantCis,vQuantSide,vQuantAnds);
    iVar1 = Gia_ManQuantExistInt(p0,iLit,vQuantCis,vQuantSide,vQuantAnds);
    if (vQuantCis->pArray != (int *)0x0) {
      free(vQuantCis->pArray);
    }
    free(vQuantCis);
    if (vQuantSide->pArray != (int *)0x0) {
      free(vQuantSide->pArray);
    }
    free(vQuantSide);
    if (vQuantAnds->pArray != (int *)0x0) {
      free(vQuantAnds->pArray);
    }
    free(vQuantAnds);
    return iVar1;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

int Gia_ManQuantExist( Gia_Man_t * p0, int iLit, int(*pFuncCiToKeep)(void *, int), void * pData )
{
    int Res;
    Vec_Int_t * vQuantCis  = Vec_IntAlloc( 100 );
    Vec_Int_t * vQuantSide = Vec_IntAlloc( 100 );
    Vec_Int_t * vQuantAnds = Vec_IntAlloc( 100 );
    Gia_ManQuantCollect( p0, Abc_Lit2Var(iLit), pFuncCiToKeep, pData, vQuantCis, vQuantSide, vQuantAnds );
    Res = Gia_ManQuantExistInt( p0, iLit, vQuantCis, vQuantSide, vQuantAnds );
    Vec_IntFree( vQuantCis );
    Vec_IntFree( vQuantSide );
    Vec_IntFree( vQuantAnds );
    return Res;
}